

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall
Clasp::ShortImplicationsGraph::add(ShortImplicationsGraph *this,ImpType t,bool learnt,Literal *lits)

{
  bool bVar1;
  Literal q_00;
  ImplicationList *this_00;
  uint32 *in_RCX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  Literal r;
  Literal q;
  Literal p;
  uint32 *stats;
  ShortImplicationsGraph *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Literal in_stack_ffffffffffffff44;
  Literal in_stack_ffffffffffffff70;
  Literal LVar2;
  Literal LVar3;
  Literal in_stack_ffffffffffffff94;
  Literal local_34;
  Literal local_30;
  Literal local_2c;
  int *local_28;
  byte local_15;
  int local_14;
  bool local_1;
  
  local_15 = in_DL & 1;
  if (in_ESI == 3) {
    this_00 = (ImplicationList *)(in_RDI + 0x18);
  }
  else {
    this_00 = (ImplicationList *)(in_RDI + 0x10);
  }
  local_28 = (int *)((long)&(this_00->super_ImpListBase).super_type.
                            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                            .buf_ + (ulong)local_15 * 4);
  local_2c.rep_ = *in_RCX;
  local_30.rep_ = in_RCX[1];
  local_14 = in_ESI;
  if (in_ESI == 3) {
    local_34.rep_ = in_RCX[2];
  }
  else {
    local_34 = lit_false();
  }
  Literal::unflag(&local_2c);
  Literal::unflag(&local_30);
  Literal::unflag(&local_34);
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    if ((local_15 & 1) != 0) {
      Literal::flag(&local_2c);
      Literal::flag(&local_30);
      Literal::flag(&local_34);
    }
    if (local_14 == 2) {
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                (left_type *)in_stack_ffffffffffffff38);
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                (left_type *)in_stack_ffffffffffffff38);
    }
    else {
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      std::make_pair<Clasp::Literal&,Clasp::Literal&>
                ((Literal *)in_stack_ffffffffffffff38,(Literal *)0x1d04bb);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                 (right_type *)in_stack_ffffffffffffff38);
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      std::make_pair<Clasp::Literal&,Clasp::Literal&>
                ((Literal *)in_stack_ffffffffffffff38,(Literal *)0x1d050e);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                 (right_type *)in_stack_ffffffffffffff38);
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      std::make_pair<Clasp::Literal&,Clasp::Literal&>
                ((Literal *)in_stack_ffffffffffffff38,(Literal *)0x1d055b);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_right((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                 CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                 (right_type *)in_stack_ffffffffffffff38);
    }
    *local_28 = *local_28 + 1;
    local_1 = true;
  }
  else {
    in_stack_ffffffffffffff44.rep_ = in_stack_ffffffffffffff44.rep_ & 0xffffff;
    if ((local_15 & 1) != 0) {
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      LVar2.rep_ = (uint32)((ulong)in_RDI >> 0x20);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      in_stack_ffffffffffffff94.rep_ = local_34.rep_;
      bVar1 = ImplicationList::hasLearnt(this_00,in_stack_ffffffffffffff70,LVar2);
      in_stack_ffffffffffffff44.rep_ =
           CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44.rep_) ^ 0xff000000;
    }
    if ((in_stack_ffffffffffffff44.rep_ & 0x1000000) == 0) {
      local_1 = false;
    }
    else {
      q_00 = Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      LVar2.rep_ = local_34.rep_;
      LVar3.rep_ = local_30.rep_;
      ImplicationList::addLearnt
                ((ImplicationList *)CONCAT44(local_30.rep_,local_34.rep_),in_stack_ffffffffffffff94,
                 q_00);
      Literal::operator~((Literal *)in_stack_ffffffffffffff38);
      getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      ImplicationList::addLearnt
                ((ImplicationList *)CONCAT44(LVar3.rep_,LVar2.rep_),in_stack_ffffffffffffff94,q_00);
      if (local_14 == 3) {
        Literal::operator~((Literal *)in_stack_ffffffffffffff38);
        getList(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
        ImplicationList::addLearnt
                  ((ImplicationList *)CONCAT44(LVar3.rep_,LVar2.rep_),in_stack_ffffffffffffff94,q_00
                  );
      }
      *local_28 = *local_28 + 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ShortImplicationsGraph::add(ImpType t, bool learnt, const Literal* lits) {
	uint32& stats= (t == ternary_imp ? tern_ : bin_)[learnt];
	Literal p = lits[0], q = lits[1], r = (t == ternary_imp ? lits[2] : lit_false());
	p.unflag(), q.unflag(), r.unflag();
	if (!shared_) {
		if (learnt) { p.flag(), q.flag(), r.flag(); }
		if (t == binary_imp) {
			getList(~p).push_left(q);
			getList(~q).push_left(p);
		}
		else {
			getList(~p).push_right(std::make_pair(q, r));
			getList(~q).push_right(std::make_pair(p, r));
			getList(~r).push_right(std::make_pair(p, q));
		}
		++stats;
		return true;
	}
#if CLASP_HAS_THREADS
	else if (learnt && !getList(~p).hasLearnt(q, r)) {
		getList(~p).addLearnt(q, r);
		getList(~q).addLearnt(p, r);
		if (t == ternary_imp) {
			getList(~r).addLearnt(p, q);
		}
		++stats;
		return true;
	}
#endif
	return false;
}